

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

double ** EDCircles::AllocateMatrix(int noRows,int noColumns)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double **ppdVar4;
  double *pdVar5;
  int local_1c;
  int i;
  double **m;
  int noColumns_local;
  int noRows_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)noRows;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar4 = (double **)operator_new__(uVar3);
  for (local_1c = 0; local_1c < noRows; local_1c = local_1c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)noColumns;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar5 = (double *)operator_new__(uVar3);
    ppdVar4[local_1c] = pdVar5;
    memset(ppdVar4[local_1c],0,(long)noColumns << 3);
  }
  return ppdVar4;
}

Assistant:

double ** EDCircles::AllocateMatrix(int noRows, int noColumns)
{
	double **m = new double *[noRows];
	
	for (int i = 0; i<noRows; i++) {
		m[i] = new double[noColumns];
		memset(m[i], 0, sizeof(double)*noColumns);
	} // end-for

	return m;
}